

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O3

int __thiscall NTrodeObj::copy(NTrodeObj *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  iterator __position;
  NTrodeObj *this_00;
  pointer piVar1;
  undefined8 uVar2;
  pointer piVar3;
  ulong uVar4;
  ulong uVar5;
  int local_2c;
  
  this_00 = (NTrodeObj *)operator_new(0x48);
  NTrodeObj(this_00);
  std::__cxx11::string::_M_assign((string *)&this_00->id);
  piVar1 = (this->hw_chans).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar3 = (this->hw_chans).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar4 = (long)piVar3 - (long)piVar1 >> 2;
  if (0 < (int)uVar4) {
    uVar5 = 0;
    do {
      if (uVar4 <= uVar5) {
        uVar2 = std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar5);
        operator_delete(this_00,0x48);
        _Unwind_Resume(uVar2);
      }
      local_2c = piVar1[uVar5];
      __position._M_current =
           (this_00->hw_chans).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this_00->hw_chans).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this_00->hw_chans,__position,&local_2c);
        piVar1 = (this->hw_chans).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar3 = (this->hw_chans).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      else {
        *__position._M_current = local_2c;
        (this_00->hw_chans).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      uVar5 = uVar5 + 1;
      uVar4 = (long)piVar3 - (long)piVar1 >> 2;
    } while ((long)uVar5 < (long)(int)((ulong)((long)piVar3 - (long)piVar1) >> 2));
  }
  return (int)this_00;
}

Assistant:

NTrodeObj* NTrodeObj::copy() {
    NTrodeObj* newObj = new NTrodeObj();
    newObj->setId(id);
    for (int i = 0; i < (int)hw_chans.size(); i++) {
        newObj->addHWChan(hw_chans.at(i));
    }
    return(newObj);
}